

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromFirst
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar4;
  ulong extraout_RDX;
  uint uVar5;
  tCharPtr __s;
  uint uVar6;
  int iVar7;
  uint uVar8;
  VerySimpleReadOnlyString VVar9;
  
  uVar1 = find->length;
  __s = find->data;
  uVar2 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  uVar4 = (ulong)uVar2;
  iVar7 = 0;
  uVar5 = 0;
  do {
    uVar6 = uVar5;
    if (uVar5 < uVar1) {
      uVar6 = uVar1;
    }
    uVar8 = 0;
LAB_0011333e:
    if (uVar6 + iVar7 == uVar8) goto LAB_0011336d;
    if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar8) ==
        __s[uVar5 + uVar8]) break;
    uVar5 = uVar5 + 1;
    iVar7 = iVar7 + -1;
  } while( true );
  uVar8 = uVar8 + 1;
  if (uVar2 != uVar8) goto LAB_0011333e;
  uVar6 = uVar1 - uVar5;
  if (uVar6 == 0) {
LAB_0011336d:
    uVar6 = uVar1;
    if (in_CL != '\0') goto LAB_0011339b;
    this->data = "";
  }
  else {
    uVar8 = 0;
    if (in_CL == '\0') {
      uVar8 = uVar2;
    }
    __s = __s + (uVar8 + uVar5);
    if (in_CL == '\0') {
      uVar4 = (ulong)(uVar2 + uVar5);
      uVar6 = uVar1 - (uVar2 + uVar5);
    }
LAB_0011339b:
    this->data = __s;
    if (uVar6 != 0xffffffff) goto LAB_001133ad;
    if (__s != (char *)0x0) {
      sVar3 = strlen(__s);
      uVar6 = (uint)sVar3;
      uVar4 = extraout_RDX;
      goto LAB_001133ad;
    }
  }
  uVar6 = 0;
LAB_001133ad:
  this->length = uVar6;
  VVar9._8_8_ = uVar4;
  VVar9.data = (tCharPtr)this;
  return VVar9;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromFirst(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = Find(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length ? (includeFind ? data : "") : &data[includeFind ? pos : pos + (unsigned int)find.length],
	                                    pos == (unsigned int)length ? (includeFind ? (unsigned int)length : 0)
	                                                      : (includeFind ? (unsigned int)length - pos
	                                                                  : (unsigned int)length - pos - (unsigned int)find.length));
	}